

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

bool __thiscall ON_Line::IsFartherThan(ON_Line *this,double d,ON_3dPoint *P)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  
  dVar3 = P->x;
  dVar1 = (this->to).x;
  if (((dVar3 <= dVar1 + d) || (bVar2 = true, dVar3 <= (this->from).x + d)) &&
     ((dVar1 - d <= dVar3 || (bVar2 = true, (this->from).x - d <= dVar3)))) {
    dVar3 = P->y;
    dVar1 = (this->to).y;
    if (((dVar3 <= dVar1 + d) || (bVar2 = true, dVar3 <= (this->from).y + d)) &&
       ((dVar1 - d <= dVar3 || (bVar2 = true, (this->from).y - d <= dVar3)))) {
      dVar3 = P->z;
      dVar1 = (this->to).z;
      if (((dVar3 <= dVar1 + d) || (bVar2 = true, dVar3 <= (this->from).z + d)) &&
         ((dVar1 - d <= dVar3 || (bVar2 = true, (this->from).z - d <= dVar3)))) {
        dVar3 = MinimumDistanceTo(this,P);
        bVar2 = d < dVar3;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_Line::IsFartherThan( double d, const ON_3dPoint& P ) const
{
  if ( P.x > to.x+d && P.x > from.x+d )
  {
    return true;
  }
  if ( P.x < to.x-d && P.x < from.x-d )
  {
    return true;
  }
  if ( P.y > to.y+d && P.y > from.y+d )
  {
    return true;
  }
  if ( P.y < to.y-d && P.y < from.y-d )
  {
    return true;
  }
  if ( P.z > to.z+d && P.z > from.z+d )
  {
    return true;
  }
  if ( P.z < to.z-d && P.z < from.z-d )
  {
    return true;
  }
  return (MinimumDistanceTo(P) > d);
}